

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *o,Escape *escape)

{
  ostream *poVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  undefined8 *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  byte *pbVar14;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  lVar10 = *(long *)(*(long *)o + -0x18);
  uVar3 = *(undefined4 *)(o + lVar10 + 0x18);
  if ((escape->value)._M_string_length != 0) {
    pbVar5 = (byte *)(escape->value)._M_dataplus._M_p;
    do {
      pbVar14 = pbVar5 + 1;
      bVar2 = *pbVar5;
      uVar13 = (uint)bVar2;
      switch(bVar2) {
      case 8:
        lVar10 = 2;
        pcVar12 = "\\b";
        break;
      case 9:
        lVar10 = 2;
        pcVar12 = "\\t";
        break;
      case 10:
        lVar10 = 2;
        pcVar12 = "\\n";
        break;
      case 0xb:
switchD_0012088a_caseD_b:
        pbVar6 = pbVar14;
        if (bVar2 < 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"\\u",2);
          *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
               *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
        }
        else {
          if (-1 < (char)bVar2) {
            local_50 = (uint *)CONCAT71(local_50._1_7_,bVar2);
            lVar10 = 1;
            pcVar12 = (char *)&local_50;
            break;
          }
          uVar11 = 0x80;
          uVar9 = 0xfffffffe;
          iVar4 = 0;
          do {
            iVar8 = iVar4;
            if (uVar9 == 6) {
              puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_50 = &local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"malformed UTF-8 string","");
              *puVar7 = &PTR__JSONEncodingError_0013f108;
              puVar7[1] = puVar7 + 3;
              if (local_50 == &local_40) {
                *(uint *)(puVar7 + 3) = local_40;
                *(undefined4 *)((long)puVar7 + 0x1c) = uStack_3c;
                *(undefined4 *)(puVar7 + 4) = uStack_38;
                *(undefined4 *)((long)puVar7 + 0x24) = uStack_34;
              }
              else {
                puVar7[1] = local_50;
                puVar7[3] = CONCAT44(uStack_3c,local_40);
              }
              puVar7[2] = local_48;
              local_48 = 0;
              local_40 = local_40 & 0xffffff00;
              local_50 = &local_40;
              __cxa_throw(puVar7,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError)
              ;
            }
            uVar13 = uVar13 & ~uVar11;
            uVar11 = uVar11 >> 1;
            uVar9 = uVar9 + 1;
            iVar4 = iVar8 + -1;
          } while ((uVar13 & uVar11) != 0);
          if (uVar9 != 0xffffffff) {
            pbVar6 = pbVar5 + (ulong)uVar9 + 2;
            do {
              if ((*pbVar14 & 0xc0) != 0x80) {
                puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
                local_50 = &local_40;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_50,"illegal character in multibyte sequence","");
                *puVar7 = &PTR__JSONEncodingError_0013f108;
                puVar7[1] = puVar7 + 3;
                if (local_50 == &local_40) {
                  *(uint *)(puVar7 + 3) = local_40;
                  *(undefined4 *)((long)puVar7 + 0x1c) = uStack_3c;
                  *(undefined4 *)(puVar7 + 4) = uStack_38;
                  *(undefined4 *)((long)puVar7 + 0x24) = uStack_34;
                }
                else {
                  puVar7[1] = local_50;
                  puVar7[3] = CONCAT44(uStack_3c,local_40);
                }
                puVar7[2] = local_48;
                local_48 = 0;
                local_40 = local_40 & 0xffffff00;
                local_50 = &local_40;
                __cxa_throw(puVar7,&JSONEncodingError::typeinfo,
                            JSONEncodingError::~JSONEncodingError);
              }
              pbVar14 = pbVar14 + 1;
              iVar8 = iVar8 + 1;
            } while (iVar8 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(o,"\\u",2);
          lVar10 = *(long *)o;
          *(uint *)(o + *(long *)(lVar10 + -0x18) + 0x18) =
               *(uint *)(o + *(long *)(lVar10 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar1 = o + *(long *)(lVar10 + -0x18);
          if (o[*(long *)(lVar10 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar1);
            poVar1[0xe1] = (ostream)0x1;
            lVar10 = *(long *)o;
          }
          poVar1[0xe0] = (ostream)0x30;
          *(undefined8 *)(o + *(long *)(lVar10 + -0x18) + 0x10) = 4;
        }
        std::ostream::_M_insert<unsigned_long>((ulong)o);
        pbVar5 = pbVar6;
        goto LAB_00120969;
      case 0xc:
        lVar10 = 2;
        pcVar12 = "\\f";
        break;
      case 0xd:
        lVar10 = 2;
        pcVar12 = "\\r";
        break;
      default:
        if (bVar2 == 0x22) {
          lVar10 = 2;
          pcVar12 = "\\\"";
        }
        else {
          if (bVar2 != 0x5c) goto switchD_0012088a_caseD_b;
          lVar10 = 2;
          pcVar12 = "\\\\";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,pcVar12,lVar10);
      pbVar5 = pbVar14;
LAB_00120969:
    } while (pbVar5 != (byte *)((escape->value)._M_dataplus._M_p + (escape->value)._M_string_length)
            );
    lVar10 = *(long *)(*(long *)o + -0x18);
  }
  *(undefined4 *)(o + lVar10 + 0x18) = uVar3;
  return o;
}

Assistant:

inline std::ostream & operator << (std::ostream &o, const Escape &escape)
{
    auto flags(o.flags());
    for (auto i = escape.value.begin(); i != escape.value.end();) {
        int c;
        switch (c = (unsigned char)*i++) {
            case '\b': o << "\\b"; break;
            case '\f': o << "\\f"; break;
            case '\n': o << "\\n"; break;
            case '"': o << "\\\""; break;
            case '\\': o << "\\\\"; break;
            case '\r': o << "\\r"; break;
            case '\t': o << "\\t"; break;
            default:
                if (unsigned(c) < 32) {
                    o << "\\u" << std::hex << unsigned(c);
                } else if (c & 0x80) {
                    // multibyte UTF-8: build up the unicode codepoint.
                    unsigned long v = c;
                    int count = 0;
                    for (int mask = 0x80; mask & v; mask >>= 1) {
                        if (mask == 0)
                            throw JSONEncodingError("malformed UTF-8 string");
                        count++;
                        v &= ~mask;
                    }
                    while (--count) {
                        c = (unsigned char)*i++;
                        if ((c & 0xc0) != 0x80)
                            throw JSONEncodingError("illegal character in multibyte sequence");
                        v = (v << 6) | (c & 0x3f);
                    }
                    o << "\\u" << std::hex << std::setfill('0') << std::setw(4) << v;
                } else {
                    o << (char)c;
                }
                break;
        }
    }
    o.flags(flags);
    return o;
}